

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupByState.hpp
# Opt level: O1

void __thiscall
linq::
GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>
::GroupByState(GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>
               *this,IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>
                     *in,function<bool_(const_int_&)> *transformer)

{
  _Rb_tree_header *p_Var1;
  int *piVar2;
  
  (this->super_IState<linq::IGrouping<bool,_int_&>_>)._vptr_IState =
       (_func_int **)&PTR_Init_00159648;
  (this->source).source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_001581f8;
  std::vector<int,_std::allocator<int>_>::vector(&(this->source).source.source,&(in->source).source)
  ;
  piVar2 = (in->source).end._M_current;
  (this->source).source.current._M_current = (in->source).current._M_current;
  (this->source).source.end._M_current = piVar2;
  std::function<bool_(const_int_&)>::function(&this->transformer,transformer);
  p_Var1 = &(this->result)._M_t._M_impl.super__Rb_tree_header;
  (this->result)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->result)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->result)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->result)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->result)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->current)._M_node = (_Base_ptr)0x0;
  return;
}

Assistant:

GroupByState(S&& in, const std::function<KEY(const VALUE&)>& transformer) 
				: source(in), transformer(transformer)
			{
			}